

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hpp
# Opt level: O0

string * __thiscall CJSON::EscapeString(string *__return_storage_ptr__,CJSON *this,string *str)

{
  int iVar1;
  string *psVar2;
  uchar *puVar3;
  byte *pbVar4;
  long lVar5;
  byte abStack_544 [28];
  string local_528;
  undefined1 local_508 [8];
  string Encode;
  uint8_t Carry;
  char i_1;
  uint8_t Shift;
  uint32_t UTF32;
  uint8_t c;
  int ShiftBits;
  size_t Pos;
  size_t Counter;
  int local_4c0;
  uint8_t Buf [4];
  int FreeBits;
  int Bytes;
  size_t i;
  string local_4a8;
  allocator<char> local_481;
  string local_480;
  string local_460;
  string local_440;
  allocator<char> local_419;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  allocator<char> local_389;
  string local_388;
  allocator<char> local_361;
  string local_360;
  string local_340;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  string local_2b0;
  string local_290;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_241;
  string local_240;
  string local_220;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  string local_190;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  string local_100;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_81;
  string local_80;
  string local_60;
  string local_40;
  string *local_20;
  string *str_local;
  CJSON *this_local;
  
  local_20 = str;
  str_local = (string *)this;
  this_local = (CJSON *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_60,(string *)str);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"\\",&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"\\\\",&local_b9);
  ReplaceAll(&local_40,this,&local_60,&local_80,&local_b8);
  std::__cxx11::string::operator=((string *)str,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string((string *)&local_100,(string *)str);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"\"",&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"\\\"",&local_149);
  ReplaceAll(&local_e0,this,&local_100,&local_120,&local_148);
  std::__cxx11::string::operator=((string *)str,(string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::string((string *)&local_190,(string *)str);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"/",&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"\\/",&local_1d9);
  ReplaceAll(&local_170,this,&local_190,&local_1b0,&local_1d8);
  std::__cxx11::string::operator=((string *)str,(string *)&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::string((string *)&local_220,(string *)str);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"\b",&local_241);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"\\b",&local_269);
  ReplaceAll(&local_200,this,&local_220,&local_240,&local_268);
  std::__cxx11::string::operator=((string *)str,(string *)&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator(&local_241);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::string((string *)&local_2b0,(string *)str);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"\n",&local_2d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"\\n",&local_2f9);
  ReplaceAll(&local_290,this,&local_2b0,&local_2d0,&local_2f8);
  std::__cxx11::string::operator=((string *)str,(string *)&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::string((string *)&local_340,(string *)str);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"\f",&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"\\f",&local_389);
  ReplaceAll(&local_320,this,&local_340,&local_360,&local_388);
  std::__cxx11::string::operator=((string *)str,(string *)&local_320);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::string((string *)&local_3d0,(string *)str);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"\r",&local_3f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"\\r",&local_419);
  ReplaceAll(&local_3b0,this,&local_3d0,&local_3f0,&local_418);
  std::__cxx11::string::operator=((string *)str,(string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::string((string *)&local_460,(string *)str);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"\t",&local_481);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a8,"\\t",(allocator<char> *)((long)&i + 7));
  ReplaceAll(&local_440,this,&local_460,&local_480,&local_4a8);
  std::__cxx11::string::operator=((string *)str,(string *)&local_440);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::~allocator(&local_481);
  std::__cxx11::string::~string((string *)&local_460);
  _FreeBits = (string *)0x0;
  do {
    psVar2 = (string *)std::__cxx11::string::size();
    if (psVar2 <= _FreeBits) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
      return __return_storage_ptr__;
    }
    puVar3 = (uchar *)std::__cxx11::string::operator[]((ulong)str);
    Buf = (uint8_t  [4])IsUTF8(this,*puVar3);
    if (Buf != (uint8_t  [4])0x0) {
      puVar3 = (uchar *)std::__cxx11::string::operator[]((ulong)str);
      local_4c0 = UTF8BitShift(this,*puVar3);
      memset((void *)((long)&Counter + 4),0,4);
      pbVar4 = (byte *)std::__cxx11::string::operator[]((ulong)str);
      *(byte *)((long)&Counter + (long)(int)Buf + 4) =
           *pbVar4 & (byte)(0xff >> ((byte)local_4c0 & 0x1f));
      for (Pos = 0; (Pos < (ulong)(long)(int)Buf &&
                    (psVar2 = (string *)std::__cxx11::string::size(), _FreeBits + Pos + 1 < psVar2))
          ; Pos = Pos + 1) {
        puVar3 = (uchar *)std::__cxx11::string::operator[]((ulong)str);
        iVar1 = UTF8BitShift(this,*puVar3);
        if (iVar1 != 2) break;
        pbVar4 = (byte *)std::__cxx11::string::operator[]((ulong)str);
        *(byte *)((long)&Counter + ((long)(int)Buf - (Pos + 1)) + 4) = *pbVar4 & 0x3f;
      }
      if (Pos == (long)(int)Buf) {
        Encode.field_2._12_4_ = 0;
        Encode.field_2._M_local_buf[0xb] = '\x06';
        for (Encode.field_2._M_local_buf[10] = '\0'; (int)Encode.field_2._M_local_buf[10] < (int)Buf
            ; Encode.field_2._M_local_buf[10] = Encode.field_2._M_local_buf[10] + '\x01') {
          Encode.field_2._M_local_buf[9] =
               *(byte *)((long)&Counter + (long)(Encode.field_2._M_local_buf[10] + 1) + 4) &
               (char)(4 << ((Encode.field_2._M_local_buf[10] & 0xfU) << 1)) - 1U;
          Encode.field_2._12_4_ =
               ((uint)*(byte *)((long)&Counter + (long)Encode.field_2._M_local_buf[10] + 4) |
               (uint)(byte)Encode.field_2._M_local_buf[9] <<
               (Encode.field_2._M_local_buf[0xb] & 0x1fU)) <<
               ((Encode.field_2._M_local_buf[10] & 3U) << 3) | Encode.field_2._12_4_;
          *(char *)((long)&Counter + (long)(Encode.field_2._M_local_buf[10] + 1) + 4) =
               (char)((int)(uint)*(byte *)((long)&Counter +
                                          (long)(Encode.field_2._M_local_buf[10] + 1) + 4) >>
                     (Encode.field_2._M_local_buf[10] * '\x02' + 2U & 0x1f));
          Encode.field_2._M_local_buf[0xb] = Encode.field_2._M_local_buf[0xb] + -2;
        }
        Encode.field_2._12_4_ =
             Encode.field_2._12_4_ |
             (uint)*(byte *)((long)&Counter + (long)(int)Buf + 4) << ((Buf[0] & 3) << 3);
        NumToHexStr_abi_cxx11_((string *)(abStack_544 + 0x1c),this,Encode.field_2._12_4_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (abStack_544 + 0x3c),"\\u",(string *)(abStack_544 + 0x1c));
        std::__cxx11::string::~string((string *)(abStack_544 + 0x1c));
        std::__cxx11::string::erase((ulong)str,(ulong)_FreeBits);
        std::__cxx11::string::insert((ulong)str,_FreeBits);
        lVar5 = std::__cxx11::string::size();
        _FreeBits = _FreeBits + lVar5 + -1;
        std::__cxx11::string::~string((string *)(abStack_544 + 0x3c));
      }
    }
    _FreeBits = _FreeBits + 1;
  } while( true );
}

Assistant:

inline std::string EscapeString(std::string str)
        {
            str = ReplaceAll(str, "\\", "\\\\");
            str = ReplaceAll(str, "\"", "\\\"");
            str = ReplaceAll(str, "/", "\\/");
            str = ReplaceAll(str, "\b", "\\b");
            str = ReplaceAll(str, "\n", "\\n");
            str = ReplaceAll(str, "\f", "\\f");
            str = ReplaceAll(str, "\r", "\\r");
            str = ReplaceAll(str, "\t", "\\t");

            //UTF-8 decoding.
            for(size_t i = 0; i < str.size(); i++)
            {
                int Bytes = IsUTF8(str[i]);
                if(Bytes)
                {
                    int FreeBits = UTF8BitShift(str[i]);
                    uint8_t Buf[sizeof(uint32_t)] = {0};
                    Buf[Bytes] = str[i] & (0xFF >> FreeBits);

                    size_t Counter = 0;

                    for (; Counter < Bytes; Counter++)
                    {
                        size_t Pos = i + Counter + 1;
                        if(Pos >= str.size())   //End of string?
                            break;

                        int ShiftBits = UTF8BitShift(str[Pos]);
                        if(ShiftBits != 2)  //All second Bytes needs to begin with 10xxxxxx, otherwise its not utf-8.
                            break;

                        uint8_t c = str[Pos] & (0xFF >> ShiftBits);
                        Buf[Bytes - (Counter + 1)] = c;
                    }

                    //We have valid UTF8
                    if(Counter == Bytes)
                    {
                        uint32_t UTF32 = 0;
                        uint8_t Shift = 6;

                        for(char i = 0; i < Bytes; i++)
                        {
                            //ä - xxx00011 xx100100
                            //𝄞 - xxxxx000 xx011101 xx000100 xx011110

                            //1 - << 6
                            //ä - xxx000xx 11100100
                            //xxx000xx >> 2 - xxxxx000 11100100
                            //End



                            //1 - << 6
                            //𝄞 - xxxxx000 xx011101 xx0001xx 00011110
                            //xx0001xx >> 2 - xxxxx000 xx011101 xxxx0001 00011110

                            //2 - << 4
                            //𝄞 - xxxxx000 xx01xxxx 11010001 00011110
                            //xx01xxxx >> 4 - xxxxx000 xxxxxx01 11010001 00011110

                            //3 - << 2
                            //𝄞 - xxxxxxxx xxx00001 11010001 00011110
                            //End

                            //i = xx100100

                            uint8_t Carry = (Buf[i + 1] & ((0x4 << i * 2) - 1));
        
                            UTF32 |= (Buf[i] | (Carry << Shift)) << (8 * i);
                            Buf[i + 1] >>= i * 2 + 2;

                            Shift -= 2;

                            // UTF32 |= (Buf[i] | ((Buf[i + 1] & ((0x4 << i * 2) - 1)) << ((Bytes + 1 - i) * 2))) << (8 * i);
                            // Buf[i + 1] >>= i * 2 + 2;
                        }

                        UTF32 |= Buf[Bytes] << (8 * Bytes);

                        std::string Encode = "\\u" + NumToHexStr(UTF32);
                        str.erase(i, Bytes + 1);
                        str.insert(i, Encode);
                        i += Encode.size() - 1;
                    }
                }
            }

            return str;
        }